

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

bool __thiscall front::syntax::SyntaxAnalyze::match_one_word(SyntaxAnalyze *this,Token tk)

{
  _func_int **pp_Var1;
  pointer pWVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  ostream *poVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type __dnew;
  string local_130;
  undefined1 local_110 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  uint local_d8 [4];
  size_t local_c8;
  bool local_c0;
  _func_int *local_b8;
  size_type local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined **local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 local_70;
  string local_68;
  Timestamp local_48;
  
  uVar6 = this->matched_index + 1;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
             -0x5555555555555555) <= uVar6) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
                  ,0x665,"bool front::syntax::SyntaxAnalyze::match_one_word(Token)");
  }
  bVar4 = word::Word::match_token(pWVar2 + uVar6,tk);
  if (!bVar4) {
    return bVar4;
  }
  if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                             *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo
                                    ,&AixLog::Log::typeinfo,0);
  }
  if (plVar7 == (long *)0x0) {
    pp_Var1 = (_func_int **)(local_110 + 0x10);
    local_110._16_6_ = 0x6563617254;
    local_110._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x5;
    local_110._0_8_ = pp_Var1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,(char *)pp_Var1,5);
    if ((_func_int **)local_110._0_8_ != pp_Var1) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
    }
LAB_001a13dd:
    local_90 = &local_80;
    local_98 = &PTR__Tag_001edee0;
    local_88 = 0;
    local_80 = 0;
    local_70 = 1;
    if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0);
    }
    if (lVar8 != 0) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)(lVar8 + 0x148));
      if (iVar5 != 0) goto LAB_001a18b6;
      std::__cxx11::string::_M_assign((string *)(lVar8 + 0x90));
      *(undefined1 *)(lVar8 + 0xb0) = local_70;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 0x148));
    }
    local_48.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_48._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001edeb0;
    local_48.is_null_ = false;
    if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0);
    }
    if (lVar8 == 0) {
      local_b8 = (_func_int *)0x15;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_130._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_b8);
      local_130.field_2._M_allocated_capacity = (size_type)local_b8;
      builtin_strncpy(local_130._M_dataplus._M_p,"%Y-%m-%d %H-%M-%S.#ms",0x15);
      local_130._M_string_length = (size_type)local_b8;
      local_130._M_dataplus._M_p[(long)local_b8] = '\0';
      AixLog::Timestamp::to_string((string *)local_110,&local_48,&local_130);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,(char *)local_110._0_8_,local_110._8_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)(lVar8 + 0x148));
      if (iVar5 != 0) goto LAB_001a18bd;
      *(bool *)(lVar8 + 0x120) = local_48.is_null_;
      ((duration *)(lVar8 + 0x118))->__r = (rep)local_48.time_point.__d.__r;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 0x148));
    }
    paVar11 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"match_one_word","");
    local_b8 = (_func_int *)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
               ,"");
    sVar3 = local_130._M_string_length;
    local_110._8_8_ = &local_f8;
    local_110._0_8_ = &PTR__Function_001edf10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == paVar11) {
      local_f8._8_4_ = local_130.field_2._8_4_;
      local_f8._12_4_ = local_130.field_2._12_4_;
    }
    else {
      local_110._8_8_ = local_130._M_dataplus._M_p;
    }
    local_f8._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    local_e8._M_p = (pointer)local_d8;
    local_110._16_8_ = local_130._M_string_length;
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity =
         local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (local_b8 == (_func_int *)&local_a8) {
      local_d8[2] = uStack_a0;
      local_d8[3] = uStack_9c;
    }
    else {
      local_e8._M_p = (pointer)local_b8;
    }
    local_e0 = local_b0;
    local_b0 = 0;
    lVar8 = 0;
    local_a8 = local_a8 & 0xffffff00;
    local_c8 = 0x660;
    local_c0 = false;
    local_130._M_dataplus._M_p = (pointer)paVar11;
    local_b8 = (_func_int *)&local_a8;
    if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) != 0) {
      lVar8 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0);
    }
    if (lVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,(char *)local_110._8_8_,sVar3);
    }
    else {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)(lVar8 + 0x148));
      if (iVar5 != 0) goto LAB_001a18c4;
      std::__cxx11::string::_M_assign((string *)(lVar8 + 0xc0));
      std::__cxx11::string::_M_assign((string *)(lVar8 + 0xe0));
      *(bool *)(lVar8 + 0x108) = local_c0;
      *(size_t *)(lVar8 + 0x100) = local_c8;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 0x148));
    }
    word::Word::get_self_abi_cxx11_
              (&local_68,
               (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start + this->matched_index + 1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::clog,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    AixLog::Function::~Function((Function *)local_110);
    if (local_b8 != (_func_int *)&local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,local_a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_98 = &PTR__Tag_001edee0;
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
    this->matched_index = this->matched_index + 1;
    return bVar4;
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)(plVar7 + 0x29));
  if (iVar5 == 0) {
    if ((char)plVar7[0x10] != '\0') {
      (**(code **)(*plVar7 + 0x30))(plVar7);
      *(undefined1 *)(plVar7 + 0x10) = 0;
      plVar7[0x23] = 0;
      *(undefined1 *)(plVar7 + 0x24) = 1;
      local_110._0_8_ = &PTR__Tag_001edee0;
      local_110._16_8_ = (_func_int *)0x0;
      local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
      local_e8._M_p._0_1_ = 1;
      local_110._8_8_ = &local_f8;
      std::__cxx11::string::_M_assign((string *)(plVar7 + 0x12));
      *(undefined1 *)(plVar7 + 0x16) = local_e8._M_p._0_1_;
      local_110._0_8_ = &PTR__Tag_001edee0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._8_8_ != &local_f8) {
        operator_delete((void *)local_110._8_8_,local_f8._M_allocated_capacity + 1);
      }
      AixLog::Function::Function((Function *)local_110,(nullptr_t)0x0);
      std::__cxx11::string::_M_assign((string *)(plVar7 + 0x18));
      std::__cxx11::string::_M_assign((string *)(plVar7 + 0x1c));
      *(bool *)(plVar7 + 0x21) = local_c0;
      plVar7[0x20] = local_c8;
      AixLog::Function::~Function((Function *)local_110);
      *(undefined1 *)(plVar7 + 0x25) = 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(plVar7 + 0x29));
    goto LAB_001a13dd;
  }
  iVar5 = std::__throw_system_error(iVar5);
LAB_001a18b6:
  iVar5 = std::__throw_system_error(iVar5);
LAB_001a18bd:
  iVar5 = std::__throw_system_error(iVar5);
LAB_001a18c4:
  uVar10 = std::__throw_system_error(iVar5);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_98 = &PTR__Tag_001edee0;
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

bool SyntaxAnalyze::match_one_word(Token tk) {
  bool return_value = false;
  if (matched_index + 1 < word_list.size()) {
    if (word_list[matched_index + 1].match_token(tk)) {
      LOG(TRACE) << word_list[matched_index + 1].get_self() << std::endl;
      matched_index++;
      return_value = true;
    }
  } else {
    assert(false);
  }
  return return_value;
}